

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall
icu_63::VTimeZone::writeZone
          (VTimeZone *this,VTZWriter *w,BasicTimeZone *basictz,UVector *customProps,
          UErrorCode *status)

{
  short sVar1;
  UErrorCode UVar2;
  ulong uVar3;
  byte bVar4;
  UBool UVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  uint uVar11;
  int iVar12;
  UnicodeString *src;
  TimeZoneRule *pTVar13;
  AnnualTimeZoneRule *pAVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DateTimeRule *pDVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  int srcLength;
  int iVar21;
  UDate UVar22;
  int local_260;
  int local_25c;
  VTimeZone *local_258;
  int local_248;
  int local_244;
  UDate local_240;
  AnnualTimeZoneRule *local_238;
  int32_t month;
  int32_t year;
  int local_220;
  int local_21c;
  int32_t mid;
  int32_t dow;
  UDate local_210;
  UDate local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  UDate local_1c8;
  UDate local_1c0;
  ulong local_1b8;
  UDate local_1b0;
  int32_t local_1a4;
  int local_1a0;
  int32_t local_19c;
  BasicTimeZone *local_198;
  int32_t dst;
  int32_t raw;
  int32_t dom;
  ulong local_180;
  ulong local_178;
  UObject local_170;
  undefined6 *local_168;
  int32_t doy;
  UnicodeString stdName;
  UnicodeString dstName;
  UnicodeString name;
  UnicodeString tzid;
  TimeZoneTransition tzt;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_198 = basictz;
  writeHeaders(this,w,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if ((customProps != (UVector *)0x0) && (0 < customProps->count)) {
    iVar19 = 0;
    do {
      src = (UnicodeString *)UVector::elementAt(customProps,iVar19);
      sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (src->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      UnicodeString::doAppend(w->out,src,0,iVar6);
      UnicodeString::doAppend(w->out,L"\r\n",0,-1);
      local_168 = &ICAL_NEWLINE;
      iVar19 = iVar19 + 1;
    } while (iVar19 < customProps->count);
  }
  dstName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  dstName.fUnion.fStackFields.fLengthAndFlags = 2;
  stdName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  stdName.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneTransition::TimeZoneTransition(&tzt);
  local_170._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e5ab8;
  name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  name.fUnion.fStackFields.fLengthAndFlags = 2;
  local_1a0 = 0x7fffffff;
  local_240 = -1.84303902528e+17;
  bVar18 = true;
  local_210 = 0.0;
  local_1c0 = 0.0;
  local_208 = 0.0;
  local_1c8 = 0.0;
  local_1f8 = 0;
  local_1a4 = 0;
  local_1b8 = 0;
  local_238 = (AnnualTimeZoneRule *)0x0;
  local_25c = 0;
  local_21c = 0;
  local_244 = 0;
  local_178 = 0;
  local_1d0 = 0;
  local_1d8 = 0;
  local_1e0 = 0;
  local_19c = 0;
  local_200 = 0;
  local_258 = (VTimeZone *)0x0;
  local_1f0 = 0;
  local_1e8 = 0;
  local_180 = 0;
  local_248 = 0;
  local_220 = 0;
  local_260 = 0;
  do {
    while( true ) {
      iVar19 = (*(local_198->super_TimeZone).super_UObject._vptr_UObject[0xe])
                         (local_240,local_198,0,&tzt);
      if ((char)iVar19 == '\0') {
        if (bVar18) {
          (*(local_198->super_TimeZone).super_UObject._vptr_UObject[6])
                    (0,local_198,0,&raw,&dst,status);
          if (U_ZERO_ERROR < *status) goto LAB_0020dadf;
          iVar19 = raw + dst;
          tzid.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_170._vptr_UObject;
          tzid.fUnion.fStackFields.fLengthAndFlags = 2;
          UnicodeString::operator=(&tzid,&(local_198->super_TimeZone).fID);
          getDefaultTZName(&tzid,dst != 0,&name);
          writeZonePropsByTime(this,w,dst != 0,&name,iVar19,iVar19,0.0 - (double)iVar19,'\0',status)
          ;
          UVar2 = *status;
          UnicodeString::~UnicodeString(&tzid);
          if (U_ZERO_ERROR < UVar2) goto LAB_0020dadf;
          goto LAB_0020dad2;
        }
        goto LAB_0020d6c1;
      }
      local_240 = TimeZoneTransition::getTime(&tzt);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      TimeZoneRule::getName(pTVar13,&name);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      iVar6 = TimeZoneRule::getDSTSavings(pTVar13);
      pTVar13 = TimeZoneTransition::getFrom(&tzt);
      iVar7 = TimeZoneRule::getRawOffset(pTVar13);
      pTVar13 = TimeZoneTransition::getFrom(&tzt);
      iVar8 = TimeZoneRule::getDSTSavings(pTVar13);
      pTVar13 = TimeZoneTransition::getFrom(&tzt);
      iVar9 = TimeZoneRule::getDSTSavings(pTVar13);
      local_1b0 = (UDate)CONCAT44(local_1b0._4_4_,iVar9);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      iVar9 = TimeZoneRule::getRawOffset(pTVar13);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      iVar10 = TimeZoneRule::getDSTSavings(pTVar13);
      UVar22 = TimeZoneTransition::getTime(&tzt);
      iVar19 = iVar8 + iVar7;
      Grego::timeToFields(UVar22 + (double)iVar19,&year,&month,&dom,&dow,&doy,&mid);
      uVar11 = Grego::dayOfWeekInMonth(year,month,dom);
      uVar3 = local_1b8;
      iVar21 = iVar10 + iVar9;
      if (iVar6 == 0) break;
      if (local_238 == (AnnualTimeZoneRule *)0x0) {
        pTVar13 = TimeZoneTransition::getTo(&tzt);
        if (pTVar13 == (TimeZoneRule *)0x0) {
LAB_0020d371:
          local_238 = (AnnualTimeZoneRule *)0x0;
        }
        else {
          pAVar14 = (AnnualTimeZoneRule *)
                    __dynamic_cast(pTVar13,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
          local_238 = (AnnualTimeZoneRule *)0x0;
          if (pAVar14 != (AnnualTimeZoneRule *)0x0) {
            iVar6 = AnnualTimeZoneRule::getEndYear(pAVar14);
            if (iVar6 != local_1a0) goto LAB_0020d371;
            pTVar13 = TimeZoneTransition::getTo(&tzt);
            iVar12 = (*(pTVar13->super_UObject)._vptr_UObject[3])(pTVar13);
            local_238 = (AnnualTimeZoneRule *)CONCAT44(extraout_var_00,iVar12);
          }
        }
      }
      iVar12 = (int)uVar3;
      if (iVar12 < 1) {
LAB_0020d516:
        UnicodeString::operator=(&dstName,&name);
        local_180 = (ulong)(uint)year;
        local_1e8 = (ulong)(uint)month;
        local_1f0 = (ulong)(uint)dow;
        local_1b8 = 1;
        local_1a4 = mid;
        local_1f8 = (ulong)uVar11;
        local_220 = local_1b0._0_4_;
        local_260 = iVar19;
        local_248 = iVar21;
        local_210 = local_240;
      }
      else {
        if (year != (int)local_180 + iVar12) {
LAB_0020d47a:
          if (iVar12 == 1) {
            writeZonePropsByTime(this,w,'\x01',&dstName,local_260,local_248,local_210,'\x01',status)
            ;
          }
          else {
            writeZonePropsByDOW(this,w,'\x01',&dstName,local_260,local_248,(int32_t)local_1e8,
                                (int32_t)local_1f8,(int32_t)local_1f0,local_210,local_1c0,status);
          }
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020d516;
          goto LAB_0020dadf;
        }
        if ((dstName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          uVar16 = dstName.fUnion.fFields.fLength;
          if (-1 < dstName.fUnion.fStackFields.fLengthAndFlags) {
            uVar16 = (int)dstName.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          iVar20 = 0;
          if ((int)uVar16 < 0) {
            iVar20 = uVar16;
          }
          srcLength = uVar16 - iVar20;
          if ((int)uVar16 <= uVar16 - iVar20) {
            srcLength = uVar16;
          }
          if ((int)uVar16 < 0) {
            srcLength = 0;
          }
          uVar16 = name.fUnion.fFields.fLength;
          if (-1 < name.fUnion.fStackFields.fLengthAndFlags) {
            uVar16 = (int)name.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          uVar17 = dstName.fUnion.fStackFields.fBuffer;
          if ((dstName.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
            uVar17 = dstName.fUnion.fFields.fArray;
          }
          bVar4 = UnicodeString::doCompare(&name,0,uVar16,(UChar *)uVar17,iVar20,srcLength);
        }
        else {
          bVar4 = ~(byte)name.fUnion.fStackFields.fLengthAndFlags & 1;
        }
        if ((((bVar4 != 0) || (local_260 != iVar19)) || (local_248 != iVar21)) ||
           ((((int)local_1e8 != month || ((int)local_1f0 != dow)) ||
            (((uint)local_1f8 != uVar11 || (local_1a4 != mid)))))) goto LAB_0020d47a;
        local_1b8 = (ulong)(iVar12 + 1);
      }
      bVar18 = false;
      local_1c0 = local_240;
      if ((local_258 != (VTimeZone *)0x0) && (local_238 != (AnnualTimeZoneRule *)0x0))
      goto LAB_0020d706;
    }
    if (local_258 == (VTimeZone *)0x0) {
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      if (pTVar13 == (TimeZoneRule *)0x0) {
LAB_0020d0ac:
        local_258 = (VTimeZone *)0x0;
      }
      else {
        pAVar14 = (AnnualTimeZoneRule *)
                  __dynamic_cast(pTVar13,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
        local_258 = (VTimeZone *)0x0;
        if (pAVar14 != (AnnualTimeZoneRule *)0x0) {
          iVar6 = AnnualTimeZoneRule::getEndYear(pAVar14);
          if (iVar6 != local_1a0) goto LAB_0020d0ac;
          pTVar13 = TimeZoneTransition::getTo(&tzt);
          iVar12 = (*(pTVar13->super_UObject)._vptr_UObject[3])(pTVar13);
          local_258 = (VTimeZone *)CONCAT44(extraout_var,iVar12);
        }
      }
    }
    if ((int)local_200 < 1) {
LAB_0020d256:
      UnicodeString::operator=(&stdName,&name);
      local_178 = (ulong)(uint)year;
      local_1d0 = (ulong)(uint)month;
      local_1d8 = (ulong)(uint)dow;
      local_200 = 1;
      local_19c = mid;
      local_21c = local_1b0._0_4_;
      local_1e0 = (ulong)uVar11;
      local_25c = iVar19;
      local_244 = iVar21;
      local_208 = local_240;
    }
    else {
      if (year != (int)local_200 + (int)local_178) {
LAB_0020d1bf:
        if ((int)local_200 == 1) {
          writeZonePropsByTime(this,w,'\0',&stdName,local_25c,local_244,local_208,'\x01',status);
        }
        else {
          writeZonePropsByDOW(this,w,'\0',&stdName,local_25c,local_244,(int32_t)local_1d0,
                              (int32_t)local_1e0,(int32_t)local_1d8,local_208,local_1c8,status);
        }
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020d256;
        goto LAB_0020dadf;
      }
      if ((stdName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        uVar16 = stdName.fUnion.fFields.fLength;
        if (-1 < stdName.fUnion.fStackFields.fLengthAndFlags) {
          uVar16 = (int)stdName.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar12 = 0;
        if ((int)uVar16 < 0) {
          iVar12 = uVar16;
        }
        iVar20 = uVar16 - iVar12;
        if ((int)uVar16 <= uVar16 - iVar12) {
          iVar20 = uVar16;
        }
        if ((int)uVar16 < 0) {
          iVar20 = 0;
        }
        uVar16 = name.fUnion.fFields.fLength;
        if (-1 < name.fUnion.fStackFields.fLengthAndFlags) {
          uVar16 = (int)name.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar17 = stdName.fUnion.fStackFields.fBuffer;
        if ((stdName.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
          uVar17 = stdName.fUnion.fFields.fArray;
        }
        bVar4 = UnicodeString::doCompare(&name,0,uVar16,(UChar *)uVar17,iVar12,iVar20);
      }
      else {
        bVar4 = ~(byte)name.fUnion.fStackFields.fLengthAndFlags & 1;
      }
      if (((((bVar4 != 0) || (local_25c != iVar19)) || (local_244 != iVar21)) ||
          (((int)local_1d0 != month || ((int)local_1d8 != dow)))) ||
         (((uint)local_1e0 != uVar11 || (local_19c != mid)))) goto LAB_0020d1bf;
      local_200 = (ulong)((int)local_200 + 1);
    }
    bVar18 = false;
    local_1c8 = local_240;
  } while ((local_258 == (VTimeZone *)0x0) || (local_238 == (AnnualTimeZoneRule *)0x0));
LAB_0020d6c1:
  local_240 = local_1c8;
  if ((int)local_1b8 < 1) {
LAB_0020d88d:
    if ((int)local_200 < 1) {
LAB_0020dad2:
      writeFooter(local_258,w,status);
      goto LAB_0020dadf;
    }
    if (local_258 == (VTimeZone *)0x0) {
      if ((int)local_200 == 1) {
        writeZonePropsByTime(this,w,'\0',&stdName,local_25c,local_244,local_208,'\x01',status);
      }
      else {
        writeZonePropsByDOW(this,w,'\0',&stdName,local_25c,local_244,(int32_t)local_1d0,
                            (int32_t)local_1e0,(int32_t)local_1d8,local_208,local_240,status);
      }
      if (U_ZERO_ERROR < *status) goto LAB_0020daef;
      local_258 = (VTimeZone *)0x0;
      goto LAB_0020dad2;
    }
    if ((int)local_200 == 1) {
      writeFinalRule(this,w,'\0',(AnnualTimeZoneRule *)local_258,local_25c - local_21c,local_21c,
                     local_208,status);
LAB_0020d9a7:
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020dad2;
    }
    else {
      pDVar15 = AnnualTimeZoneRule::getRule((AnnualTimeZoneRule *)local_258);
      UVar5 = isEquivalentDateRule((int32_t)local_1d0,(int32_t)local_1e0,(int32_t)local_1d8,pDVar15)
      ;
      if (UVar5 != '\0') {
        writeZonePropsByDOW(this,w,'\0',&stdName,local_25c,local_244,(int32_t)local_1d0,
                            (int32_t)local_1e0,(int32_t)local_1d8,local_208,1.838821689216e+17,
                            status);
        goto LAB_0020d9a7;
      }
      writeZonePropsByDOW(this,w,'\0',&stdName,local_25c,local_244,(int32_t)local_1d0,
                          (int32_t)local_1e0,(int32_t)local_1d8,local_208,local_240,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_25c = local_25c - local_21c;
        iVar19 = (*(local_258->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9])
                           (local_240);
        if ((char)iVar19 != '\0') {
          writeFinalRule(this,w,'\0',(AnnualTimeZoneRule *)local_258,local_25c,local_21c,
                         (UDate)tzid.super_Replaceable.super_UObject._vptr_UObject,status);
        }
        goto LAB_0020d9a7;
      }
    }
  }
  else {
    if (local_238 == (AnnualTimeZoneRule *)0x0) {
      if ((int)local_1b8 == 1) {
        writeZonePropsByTime(this,w,'\x01',&dstName,local_260,local_248,local_210,'\x01',status);
      }
      else {
        writeZonePropsByDOW(this,w,'\x01',&dstName,local_260,local_248,(int32_t)local_1e8,
                            (int32_t)local_1f8,(int32_t)local_1f0,local_210,local_1c0,status);
      }
      local_238 = (AnnualTimeZoneRule *)0x0;
LAB_0020d884:
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020d88d;
    }
    else {
LAB_0020d706:
      local_1b0 = local_1c0;
      local_240 = local_1c8;
      if ((int)local_1b8 == 1) {
        writeFinalRule(this,w,'\x01',local_238,local_260 - local_220,local_220,local_210,status);
        goto LAB_0020d884;
      }
      pDVar15 = AnnualTimeZoneRule::getRule(local_238);
      UVar5 = isEquivalentDateRule((int32_t)local_1e8,(int32_t)local_1f8,(int32_t)local_1f0,pDVar15)
      ;
      if (UVar5 != '\0') {
        writeZonePropsByDOW(this,w,'\x01',&dstName,local_260,local_248,(int32_t)local_1e8,
                            (int32_t)local_1f8,(int32_t)local_1f0,local_210,1.838821689216e+17,
                            status);
        goto LAB_0020d884;
      }
      writeZonePropsByDOW(this,w,'\x01',&dstName,local_260,local_248,(int32_t)local_1e8,
                          (int32_t)local_1f8,(int32_t)local_1f0,local_210,local_1b0,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_260 = local_260 - local_220;
        iVar19 = (*(local_238->super_TimeZoneRule).super_UObject._vptr_UObject[9])(local_1b0);
        if ((char)iVar19 != '\0') {
          writeFinalRule(this,w,'\x01',local_238,local_260,local_220,
                         (UDate)tzid.super_Replaceable.super_UObject._vptr_UObject,status);
        }
        goto LAB_0020d884;
      }
    }
LAB_0020dadf:
    if (local_258 == (VTimeZone *)0x0) goto LAB_0020daef;
  }
  (*(local_258->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
LAB_0020daef:
  if (local_238 != (AnnualTimeZoneRule *)0x0) {
    (*(local_238->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  UnicodeString::~UnicodeString(&name);
  TimeZoneTransition::~TimeZoneTransition(&tzt);
  UnicodeString::~UnicodeString(&stdName);
  UnicodeString::~UnicodeString(&dstName);
  return;
}

Assistant:

void
VTimeZone::writeZone(VTZWriter& w, BasicTimeZone& basictz,
                     UVector* customProps, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writeHeaders(w, status);
    if (U_FAILURE(status)) {
        return;
    }

    if (customProps != NULL) {
        for (int32_t i = 0; i < customProps->size(); i++) {
            UnicodeString *custprop = (UnicodeString*)customProps->elementAt(i);
            w.write(*custprop);
            w.write(ICAL_NEWLINE);
        }
    }

    UDate t = MIN_MILLIS;
    UnicodeString dstName;
    int32_t dstFromOffset = 0;
    int32_t dstFromDSTSavings = 0;
    int32_t dstToOffset = 0;
    int32_t dstStartYear = 0;
    int32_t dstMonth = 0;
    int32_t dstDayOfWeek = 0;
    int32_t dstWeekInMonth = 0;
    int32_t dstMillisInDay = 0;
    UDate dstStartTime = 0.0;
    UDate dstUntilTime = 0.0;
    int32_t dstCount = 0;
    AnnualTimeZoneRule *finalDstRule = NULL;

    UnicodeString stdName;
    int32_t stdFromOffset = 0;
    int32_t stdFromDSTSavings = 0;
    int32_t stdToOffset = 0;
    int32_t stdStartYear = 0;
    int32_t stdMonth = 0;
    int32_t stdDayOfWeek = 0;
    int32_t stdWeekInMonth = 0;
    int32_t stdMillisInDay = 0;
    UDate stdStartTime = 0.0;
    UDate stdUntilTime = 0.0;
    int32_t stdCount = 0;
    AnnualTimeZoneRule *finalStdRule = NULL;

    int32_t year, month, dom, dow, doy, mid;
    UBool hasTransitions = FALSE;
    TimeZoneTransition tzt;
    UBool tztAvail;
    UnicodeString name;
    UBool isDst;

    // Going through all transitions
    while (TRUE) {
        tztAvail = basictz.getNextTransition(t, FALSE, tzt);
        if (!tztAvail) {
            break;
        }
        hasTransitions = TRUE;
        t = tzt.getTime();
        tzt.getTo()->getName(name);
        isDst = (tzt.getTo()->getDSTSavings() != 0);
        int32_t fromOffset = tzt.getFrom()->getRawOffset() + tzt.getFrom()->getDSTSavings();
        int32_t fromDSTSavings = tzt.getFrom()->getDSTSavings();
        int32_t toOffset = tzt.getTo()->getRawOffset() + tzt.getTo()->getDSTSavings();
        Grego::timeToFields(tzt.getTime() + fromOffset, year, month, dom, dow, doy, mid);
        int32_t weekInMonth = Grego::dayOfWeekInMonth(year, month, dom);
        UBool sameRule = FALSE;
        const AnnualTimeZoneRule *atzrule;
        if (isDst) {
            if (finalDstRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalDstRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (dstCount > 0) {
                if (year == dstStartYear + dstCount
                        && name.compare(dstName) == 0
                        && dstFromOffset == fromOffset
                        && dstToOffset == toOffset
                        && dstMonth == month
                        && dstDayOfWeek == dow
                        && dstWeekInMonth == weekInMonth
                        && dstMillisInDay == mid) {
                    // Update until time
                    dstUntilTime = t;
                    dstCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (dstCount == 1) {
                        writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            } 
            if (!sameRule) {
                // Reset this DST information
                dstName = name;
                dstFromOffset = fromOffset;
                dstFromDSTSavings = fromDSTSavings;
                dstToOffset = toOffset;
                dstStartYear = year;
                dstMonth = month;
                dstDayOfWeek = dow;
                dstWeekInMonth = weekInMonth;
                dstMillisInDay = mid;
                dstStartTime = dstUntilTime = t;
                dstCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        } else {
            if (finalStdRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalStdRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (stdCount > 0) {
                if (year == stdStartYear + stdCount
                        && name.compare(stdName) == 0
                        && stdFromOffset == fromOffset
                        && stdToOffset == toOffset
                        && stdMonth == month
                        && stdDayOfWeek == dow
                        && stdWeekInMonth == weekInMonth
                        && stdMillisInDay == mid) {
                    // Update until time
                    stdUntilTime = t;
                    stdCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (stdCount == 1) {
                        writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            }
            if (!sameRule) {
                // Reset this STD information
                stdName = name;
                stdFromOffset = fromOffset;
                stdFromDSTSavings = fromDSTSavings;
                stdToOffset = toOffset;
                stdStartYear = year;
                stdMonth = month;
                stdDayOfWeek = dow;
                stdWeekInMonth = weekInMonth;
                stdMillisInDay = mid;
                stdStartTime = stdUntilTime = t;
                stdCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        }
    }
    if (!hasTransitions) {
        // No transition - put a single non transition RDATE
        int32_t raw, dst, offset;
        basictz.getOffset(0.0/*any time*/, FALSE, raw, dst, status);
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
        offset = raw + dst;
        isDst = (dst != 0);
        UnicodeString tzid;
        basictz.getID(tzid);
        getDefaultTZName(tzid, isDst, name);        
        writeZonePropsByTime(w, isDst, name,
                offset, offset, DEF_TZSTARTTIME - offset, FALSE, status);    
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
    } else {
        if (dstCount > 0) {
            if (finalDstRule == NULL) {
                if (dstCount == 1) {
                    writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                            dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (dstCount == 1) {
                    writeFinalRule(w, TRUE, finalDstRule,
                            dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, dstStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(dstMonth, dstWeekInMonth, dstDayOfWeek, finalDstRule->getRule())) {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalDstRule->getNextStart(dstUntilTime, dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, TRUE, finalDstRule,
                                    dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }
        if (stdCount > 0) {
            if (finalStdRule == NULL) {
                if (stdCount == 1) {
                    writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                            stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (stdCount == 1) {
                    writeFinalRule(w, FALSE, finalStdRule,
                            stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, stdStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(stdMonth, stdWeekInMonth, stdDayOfWeek, finalStdRule->getRule())) {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalStdRule->getNextStart(stdUntilTime, stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, FALSE, finalStdRule,
                                    stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }            
    }
    writeFooter(w, status);

cleanupWriteZone:

    if (finalStdRule != NULL) {
        delete finalStdRule;
    }
    if (finalDstRule != NULL) {
        delete finalDstRule;
    }
}